

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneDiffer.cpp
# Opt level: O0

string * __thiscall
Assimp::dumpFace_abi_cxx11_(string *__return_storage_ptr__,Assimp *this,aiFace *face)

{
  uint local_1a4;
  stringstream local_1a0 [4];
  uint i;
  stringstream stream;
  ostream local_190 [376];
  Assimp *local_18;
  aiFace *face_local;
  
  local_18 = this;
  face_local = (aiFace *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  for (local_1a4 = 0; local_1a4 < *(uint *)local_18; local_1a4 = local_1a4 + 1) {
    std::ostream::operator<<(local_190,*(uint *)(*(long *)(local_18 + 8) + (ulong)local_1a4 * 4));
    if (local_1a4 < *(uint *)local_18 - 1) {
      std::operator<<(local_190,", ");
    }
    else {
      std::operator<<(local_190,"\n");
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static std::string dumpFace( const aiFace &face ) {
    std::stringstream stream;
    for ( unsigned int i = 0; i < face.mNumIndices; i++ ) {
        stream << face.mIndices[ i ];
        if ( i < face.mNumIndices - 1 ) {
            stream << ", ";
        }
        else {
            stream << "\n";
        }
    }
    return stream.str();
}